

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

Duration * __thiscall absl::lts_20250127::Duration::operator%=(Duration *this,Duration rhs)

{
  uint uVar1;
  uint uVar2;
  HiRep HVar3;
  HiRep HVar4;
  
  uVar2 = rhs.rep_lo_;
  HVar4 = rhs.rep_hi_;
  HVar3 = this->rep_hi_;
  uVar1 = this->rep_lo_;
  if (uVar2 != 0xffffffff && uVar1 != 0xffffffff) {
    if (HVar4 != (HiRep)0x0) {
      if (uVar2 == 0 && 0 < (long)HVar4) {
        if ((long)HVar3 < 0) {
          HVar3 = (HiRep)((long)((long)HVar3 + (ulong)(uVar1 != 0)) % (long)HVar4 -
                         (ulong)(uVar1 != 0));
        }
        else {
          if (HVar4 == (HiRep)0x1) {
            (this->rep_hi_).lo_ = 0;
            (this->rep_hi_).hi_ = 0;
            return this;
          }
          HVar3 = (HiRep)((ulong)HVar3 % (ulong)HVar4);
        }
        this->rep_hi_ = HVar3;
        return this;
      }
      goto LAB_002b8184;
    }
    if ((int)uVar2 < 4000) {
      if (uVar2 == 4) {
        if (0x225c17c < (ulong)HVar3 >> 8) goto LAB_002b8184;
        goto LAB_002b81a2;
      }
      if (uVar2 != 400) goto LAB_002b8184;
      HVar4.lo_ = 0xbf94d454;
      HVar4.hi_ = 0xd6;
    }
    else if (uVar2 == 4000) {
      HVar4.lo_ = 0x7bd04b55;
      HVar4.hi_ = 0x863;
    }
    else {
      if (uVar2 != 4000000) goto LAB_002b8184;
      HVar4.lo_ = 0xa5a64af6;
      HVar4.hi_ = 0x20c49b;
    }
    if ((ulong)HVar3 <= (ulong)HVar4) {
LAB_002b81a2:
      (this->rep_hi_).lo_ = 0;
      (this->rep_hi_).hi_ = 0;
      this->rep_lo_ = uVar1 % uVar2;
      return this;
    }
  }
LAB_002b8184:
  anon_unknown_1::IDivSlowPath(false,*this,rhs,this);
  return this;
}

Assistant:

Duration& Duration::operator%=(Duration rhs) {
  IDivDurationImpl(false, *this, rhs, this);
  return *this;
}